

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

bool __thiscall httplib::ClientImpl::send_(ClientImpl *this,Request *req,Response *res,Error *error)

{
  Socket *socket;
  Headers *this_00;
  ulong uVar1;
  pthread_t pVar2;
  Headers *pHVar3;
  Error *pEVar4;
  bool bVar5;
  int iVar6;
  pthread_t pVar7;
  iterator iVar8;
  _Rb_tree_node_base *p_Var9;
  byte bVar10;
  SSLClient *scli;
  bool ret;
  bool close_connection;
  scope_exit se;
  bool local_da;
  bool local_d9;
  Request *local_d8;
  Socket *local_d0;
  Response *local_c8;
  Error *local_c0;
  _Function_base local_b8;
  _Any_data local_98 [2];
  _Any_data local_70;
  Response *local_60;
  bool *local_58;
  Error *local_50;
  anon_class_24_3_3fbdb9c1 local_48;
  
  local_d8 = req;
  std::mutex::lock(&this->socket_mutex_);
  this->socket_should_be_closed_when_request_is_done_ = false;
  socket = &this->socket_;
  iVar6 = (this->socket_).sock;
  local_d0 = socket;
  local_c8 = res;
  local_c0 = error;
  if (iVar6 == -1) {
LAB_00131b18:
    iVar6 = (*this->_vptr_ClientImpl[3])(this,socket,error);
    if ((char)iVar6 == '\0') {
LAB_00131bc0:
      bVar5 = false;
      res = (Response *)0x0;
      goto LAB_00131bdf;
    }
    iVar6 = (*this->_vptr_ClientImpl[6])(this);
    if ((char)iVar6 != '\0') {
      if (((this->proxy_host_)._M_string_length != 0) && (this->proxy_port_ != -1)) {
        local_98[0]._M_pod_data[0] = 0;
        bVar5 = SSLClient::connect_with_proxy
                          ((SSLClient *)this,socket,res,(bool *)local_98[0]._M_pod_data,error);
        if (!bVar5) {
          res = (Response *)(ulong)(byte)local_98[0]._0_1_;
          bVar5 = false;
          goto LAB_00131bdf;
        }
      }
      bVar5 = SSLClient::initialize_ssl((SSLClient *)this,socket,error);
      if (!bVar5) goto LAB_00131bc0;
    }
  }
  else {
    bVar5 = detail::is_socket_alive(iVar6);
    if (!bVar5) {
      (*this->_vptr_ClientImpl[4])(this,socket,0);
      shutdown_socket(this,socket);
      close_socket(this,socket);
      goto LAB_00131b18;
    }
  }
  uVar1 = this->socket_requests_in_flight_;
  if (uVar1 < 2) {
    pVar7 = pthread_self();
  }
  else {
    pVar2 = (this->socket_requests_are_from_thread_)._M_thread;
    pVar7 = pthread_self();
    if (pVar2 != pVar7) {
      __assert_fail("socket_requests_are_from_thread_ == std::this_thread::get_id()",
                    "/workspace/llm4binary/github/license_c_cmakelists/caozhanhao[P]wxserver/thirdparty/cpp-httplib/httplib.h"
                    ,0x18fe,"bool httplib::ClientImpl::send_(Request &, Response &, Error &)");
    }
  }
  this->socket_requests_in_flight_ = uVar1 + 1;
  (this->socket_requests_are_from_thread_)._M_thread = pVar7;
  bVar5 = true;
LAB_00131bdf:
  bVar10 = (byte)res;
  pthread_mutex_unlock((pthread_mutex_t *)&this->socket_mutex_);
  if (bVar5) {
    this_00 = &local_d8->headers;
    pHVar3 = &local_d8->headers;
    for (p_Var9 = (this->default_headers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var9 != &(this->default_headers_)._M_t._M_impl.super__Rb_tree_header;
        p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
      iVar8 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&this_00->_M_t,(key_type *)(p_Var9 + 1));
      if ((_Rb_tree_header *)iVar8._M_node == &(pHVar3->_M_t)._M_impl.super__Rb_tree_header) {
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_insert_equal<std::pair<std::__cxx11::string_const,std::__cxx11::string>const&>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)this_00,
                   (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(p_Var9 + 1));
      }
    }
    local_48.ret = &local_da;
    local_da = false;
    local_d9 = (bool)(this->keep_alive_ ^ 1);
    local_48.this = this;
    local_48.close_connection = &local_d9;
    std::function<void()>::
    function<httplib::ClientImpl::send_(httplib::Request&,httplib::Response&,httplib::Error&)::_lambda()_1_,void>
              ((function<void()> *)local_70._M_pod_data,&local_48);
    detail::scope_exit::scope_exit((scope_exit *)local_98,(function<void_()> *)&local_70);
    std::_Function_base::~_Function_base((_Function_base *)&local_70);
    pEVar4 = local_c0;
    local_70._8_8_ = local_d8;
    local_60 = local_c8;
    local_50 = local_c0;
    local_70._M_unused._M_object = this;
    local_58 = &local_d9;
    std::function<bool(httplib::Stream&)>::
    function<httplib::ClientImpl::send_(httplib::Request&,httplib::Response&,httplib::Error&)::_lambda(httplib::Stream&)_1_,void>
              ((function<bool(httplib::Stream&)> *)&local_b8,(anon_class_40_5_61c9469f *)&local_70);
    iVar6 = (*this->_vptr_ClientImpl[5])(this,local_d0,&local_b8);
    local_da = SUB41(iVar6,0);
    std::_Function_base::~_Function_base(&local_b8);
    bVar10 = local_da;
    if ((local_da == false) && (*pEVar4 == Success)) {
      *pEVar4 = Unknown;
    }
    detail::scope_exit::~scope_exit((scope_exit *)local_98);
  }
  return (bool)(bVar10 & 1);
}

Assistant:

inline bool ClientImpl::send_(Request &req, Response &res, Error &error) {
  {
    std::lock_guard<std::mutex> guard(socket_mutex_);

    // Set this to false immediately - if it ever gets set to true by the end of
    // the request, we know another thread instructed us to close the socket.
    socket_should_be_closed_when_request_is_done_ = false;

    auto is_alive = false;
    if (socket_.is_open()) {
      is_alive = detail::is_socket_alive(socket_.sock);
      if (!is_alive) {
        // Attempt to avoid sigpipe by shutting down nongracefully if it seems
        // like the other side has already closed the connection Also, there
        // cannot be any requests in flight from other threads since we locked
        // request_mutex_, so safe to close everything immediately
        const bool shutdown_gracefully = false;
        shutdown_ssl(socket_, shutdown_gracefully);
        shutdown_socket(socket_);
        close_socket(socket_);
      }
    }

    if (!is_alive) {
      if (!create_and_connect_socket(socket_, error)) { return false; }

#ifdef CPPHTTPLIB_OPENSSL_SUPPORT
      // TODO: refactoring
      if (is_ssl()) {
        auto &scli = static_cast<SSLClient &>(*this);
        if (!proxy_host_.empty() && proxy_port_ != -1) {
          auto success = false;
          if (!scli.connect_with_proxy(socket_, res, success, error)) {
            return success;
          }
        }

        if (!scli.initialize_ssl(socket_, error)) { return false; }
      }
#endif
    }

    // Mark the current socket as being in use so that it cannot be closed by
    // anyone else while this request is ongoing, even though we will be
    // releasing the mutex.
    if (socket_requests_in_flight_ > 1) {
      assert(socket_requests_are_from_thread_ == std::this_thread::get_id());
    }
    socket_requests_in_flight_ += 1;
    socket_requests_are_from_thread_ = std::this_thread::get_id();
  }

  for (const auto &header : default_headers_) {
    if (req.headers.find(header.first) == req.headers.end()) {
      req.headers.insert(header);
    }
  }

  auto ret = false;
  auto close_connection = !keep_alive_;

  auto se = detail::scope_exit([&]() {
    // Briefly lock mutex in order to mark that a request is no longer ongoing
    std::lock_guard<std::mutex> guard(socket_mutex_);
    socket_requests_in_flight_ -= 1;
    if (socket_requests_in_flight_ <= 0) {
      assert(socket_requests_in_flight_ == 0);
      socket_requests_are_from_thread_ = std::thread::id();
    }

    if (socket_should_be_closed_when_request_is_done_ || close_connection ||
        !ret) {
      shutdown_ssl(socket_, true);
      shutdown_socket(socket_);
      close_socket(socket_);
    }
  });

  ret = process_socket(socket_, [&](Stream &strm) {
    return handle_request(strm, req, res, close_connection, error);
  });

  if (!ret) {
    if (error == Error::Success) { error = Error::Unknown; }
  }

  return ret;
}